

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexUtils.cpp
# Opt level: O1

void Ptex::v2_4::PtexUtils::anon_unknown_1::average<Ptex::v2_4::PtexHalf>
               (PtexHalf *src,int sstride,int uw,int vw,PtexHalf *dst,int nchan)

{
  PtexHalf *pPVar1;
  PtexHalf *pPVar2;
  long lVar3;
  long lVar4;
  uint16_t uVar5;
  int iVar6;
  long lVar7;
  ulong uVar8;
  void *__s;
  float val;
  undefined8 uStack_40;
  float local_38 [2];
  
  lVar3 = -((long)nchan * 4 + 0xfU & 0xfffffffffffffff0);
  __s = (void *)((long)local_38 + lVar3);
  local_38[0] = (float)uw;
  local_38[1] = (float)vw;
  *(undefined8 *)((long)&uStack_40 + lVar3) = 0x1199fd;
  memset(__s,0,(long)nchan << 2);
  iVar6 = (sstride / 2) * (int)local_38[1];
  if (iVar6 != 0) {
    pPVar1 = src + iVar6;
    iVar6 = nchan * (int)local_38[0];
    do {
      if (iVar6 != 0) {
        pPVar2 = src + iVar6;
        do {
          if (0 < nchan) {
            lVar4 = 0;
            do {
              lVar7 = lVar4;
              *(float *)((long)__s + lVar7 * 2) =
                   *(float *)(PtexHalf::h2fTable + (ulong)*(ushort *)((long)&src->bits + lVar7) * 4)
                   + *(float *)((long)__s + lVar7 * 2);
              lVar4 = lVar7 + 2;
            } while ((ulong)(uint)nchan * 2 != lVar7 + 2);
            src = (PtexHalf *)((long)&src[1].bits + lVar7);
          }
        } while (src != pPVar2);
      }
      src = src + (sstride / 2 - iVar6);
    } while (src != pPVar1);
  }
  if (0 < nchan) {
    local_38[1] = 1.0 / (float)((int)local_38[1] * (int)local_38[0]);
    uVar8 = 0;
    do {
      val = *(float *)((long)__s + uVar8 * 4) * local_38[1];
      *(undefined8 *)((long)&uStack_40 + lVar3) = 0x119aad;
      uVar5 = PtexHalf::fromFloat(val);
      dst[uVar8].bits = uVar5;
      uVar8 = uVar8 + 1;
    } while ((uint)nchan != uVar8);
  }
  return;
}

Assistant:

inline void average(const T* src, int sstride, int uw, int vw,
                        T* dst, int nchan)
    {
        float* buff = (float*) alloca(nchan*sizeof(float));
        memset(buff, 0, nchan*sizeof(float));
        sstride /= (int)sizeof(T);
        int rowlen = uw*nchan;
        int rowskip = sstride - rowlen;
        for (const T* end = src + vw*sstride; src != end; src += rowskip)
            for (const T* rowend = src + rowlen; src != rowend;)
                for (int i = 0; i < nchan; i++) buff[i] += (float)*src++;
        float scale = 1.0f/(float)(uw*vw);
        for (int i = 0; i < nchan; i++) dst[i] = T(buff[i]*scale);
    }